

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O0

size_t ZSTD_compressBegin_advanced_internal
                 (ZSTD_CCtx *cctx,void *dict,size_t dictSize,ZSTD_dictContentType_e dictContentType,
                 ZSTD_dictTableLoadMethod_e dtlm,ZSTD_CDict *cdict,ZSTD_CCtx_params *params,
                 unsigned_long_long pledgedSrcSize)

{
  ZSTD_compressionParameters cParams;
  uint uVar1;
  size_t code;
  ZSTD_dictTableLoadMethod_e unaff_retaddr;
  ZSTD_dictContentType_e unaff_retaddr_00;
  size_t in_stack_00000008;
  void *in_stack_00000010;
  ZSTD_CCtx *in_stack_00000018;
  size_t err_code;
  undefined4 in_stack_ffffffffffffffa4;
  ZSTD_CDict *in_stack_fffffffffffffff8;
  
  cParams.chainLog = in_stack_ffffffffffffffa4;
  cParams.windowLog = *(undefined4 *)(in_stack_00000008 + 0x1c);
  cParams._8_8_ = *(undefined8 *)(in_stack_00000008 + 4);
  cParams._16_8_ = *(undefined8 *)(in_stack_00000008 + 0xc);
  cParams.strategy = (ZSTD_strategy)*(undefined8 *)(in_stack_00000008 + 0x14);
  code = ZSTD_checkCParams(cParams);
  uVar1 = ERR_isError(code);
  if (uVar1 == 0) {
    code = ZSTD_compressBegin_internal
                     (in_stack_00000018,in_stack_00000010,in_stack_00000008,unaff_retaddr_00,
                      unaff_retaddr,in_stack_fffffffffffffff8,(ZSTD_CCtx_params *)err_code,
                      (U64)cdict,dtlm);
  }
  return code;
}

Assistant:

size_t ZSTD_compressBegin_advanced_internal(ZSTD_CCtx* cctx,
                                    const void* dict, size_t dictSize,
                                    ZSTD_dictContentType_e dictContentType,
                                    ZSTD_dictTableLoadMethod_e dtlm,
                                    const ZSTD_CDict* cdict,
                                    const ZSTD_CCtx_params* params,
                                    unsigned long long pledgedSrcSize)
{
    DEBUGLOG(4, "ZSTD_compressBegin_advanced_internal: wlog=%u", params->cParams.windowLog);
    /* compression parameters verification and optimization */
    FORWARD_IF_ERROR( ZSTD_checkCParams(params->cParams) , "");
    return ZSTD_compressBegin_internal(cctx,
                                       dict, dictSize, dictContentType, dtlm,
                                       cdict,
                                       params, pledgedSrcSize,
                                       ZSTDb_not_buffered);
}